

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int on_frame_recv(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  uint stream_id_00;
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  CURLcode CVar4;
  Curl_easy *data_00;
  char *pcVar5;
  stream_ctx *local_180;
  Curl_easy *local_170;
  stream_ctx *stream;
  uint32_t max_conn;
  int len;
  char buffer [256];
  int32_t stream_id;
  Curl_easy *data_s;
  Curl_easy *data;
  cf_h2_ctx *ctx;
  Curl_cfilter *cf;
  void *userp_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  lVar1 = *(long *)((long)userp + 0x10);
  if (userp == (void *)0x0) {
    local_170 = (Curl_easy *)0x0;
  }
  else {
    local_170 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 0x10);
  }
  stream_id_00 = (frame->hd).stream_id;
  if ((((local_170 != (Curl_easy *)0x0) &&
       ((*(ulong *)&(local_170->set).field_0x8ba >> 0x1c & 1) != 0)) && (userp != (void *)0x0)) &&
     (0 < *(int *)(*userp + 0xc))) {
    iVar2 = fr_print(frame,(char *)&max_conn,0xff);
    *(undefined1 *)((long)&max_conn + (long)iVar2) = 0;
    if (((local_170 != (Curl_easy *)0x0) &&
        ((*(ulong *)&(local_170->set).field_0x8ba >> 0x1c & 1) != 0)) &&
       ((userp != (void *)0x0 && (0 < *(int *)(*userp + 0xc))))) {
      Curl_trc_cf_infof(local_170,(Curl_cfilter *)userp,"[%d] <- %s",
                        (ulong)(uint)(frame->hd).stream_id,&max_conn);
    }
  }
  if (stream_id_00 == 0) {
    if ((frame->hd).type == '\x04') {
      if (((frame->hd).flags & 1) == 0) {
        iVar2 = *(int *)(lVar1 + 8);
        uVar3 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS)
        ;
        *(uint32_t *)(lVar1 + 8) = uVar3;
        uVar3 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_ENABLE_PUSH);
        *(byte *)(lVar1 + 200) = *(byte *)(lVar1 + 200) & 0xfb | (uVar3 != 0) << 2;
        if ((((local_170 != (Curl_easy *)0x0) &&
             ((*(ulong *)&(local_170->set).field_0x8ba >> 0x1c & 1) != 0)) && (userp != (void *)0x0)
            ) && (0 < *(int *)(*userp + 0xc))) {
          Curl_trc_cf_infof(local_170,(Curl_cfilter *)userp,"[0] MAX_CONCURRENT_STREAMS: %d",
                            (ulong)*(uint *)(lVar1 + 8));
        }
        if (((local_170 != (Curl_easy *)0x0) &&
            ((*(ulong *)&(local_170->set).field_0x8ba >> 0x1c & 1) != 0)) &&
           ((userp != (void *)0x0 && (0 < *(int *)(*userp + 0xc))))) {
          pcVar5 = "false";
          if ((*(byte *)(lVar1 + 200) >> 2 & 1) != 0) {
            pcVar5 = "TRUE";
          }
          Curl_trc_cf_infof(local_170,(Curl_cfilter *)userp,"[0] ENABLE_PUSH: %s",pcVar5);
        }
        if ((local_170 != (Curl_easy *)0x0) && (iVar2 != *(int *)(lVar1 + 8))) {
          if ((local_170 != (Curl_easy *)0x0) &&
             ((((*(ulong *)&(local_170->set).field_0x8ba >> 0x1c & 1) != 0 && (userp != (void *)0x0)
               ) && (0 < *(int *)(*userp + 0xc))))) {
            Curl_trc_cf_infof(local_170,(Curl_cfilter *)userp,
                              "[0] notify MAX_CONCURRENT_STREAMS: %u",(ulong)*(uint *)(lVar1 + 8));
          }
          Curl_multi_connchanged(local_170->multi);
        }
        if (((local_170->req).keepon & 0x2aU) == 2) {
          if ((local_170 == (Curl_easy *)0x0) || ((local_170->req).p.file == (FILEPROTO *)0x0)) {
            local_180 = (stream_ctx *)0x0;
          }
          else {
            local_180 = (stream_ctx *)((local_170->req).p.http)->h2_ctx;
          }
          if (local_180 != (stream_ctx *)0x0) {
            drain_stream((Curl_cfilter *)userp,local_170,local_180);
          }
        }
      }
    }
    else if ((frame->hd).type == '\a') {
      *(byte *)(lVar1 + 200) = *(byte *)(lVar1 + 200) & 0xfd | 2;
      *(int32_t *)(lVar1 + 0xc0) = (frame->priority).pri_spec.weight;
      *(int32_t *)(lVar1 + 0xc4) = (frame->priority).pri_spec.stream_id;
      if (local_170 != (Curl_easy *)0x0) {
        if ((local_170 != (Curl_easy *)0x0) &&
           ((*(ulong *)&(local_170->set).field_0x8ba >> 0x1c & 1) != 0)) {
          Curl_infof(local_170,"received GOAWAY, error=%d, last_stream=%u",
                     (ulong)*(uint *)(lVar1 + 0xc0),(ulong)*(uint *)(lVar1 + 0xc4));
        }
        Curl_multi_connchanged(local_170->multi);
      }
    }
    session_local._4_4_ = 0;
  }
  else {
    data_00 = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id_00);
    if (data_00 == (Curl_easy *)0x0) {
      if (((local_170 != (Curl_easy *)0x0) &&
          ((*(ulong *)&(local_170->set).field_0x8ba >> 0x1c & 1) != 0)) &&
         ((userp != (void *)0x0 && (0 < *(int *)(*userp + 0xc))))) {
        Curl_trc_cf_infof(local_170,(Curl_cfilter *)userp,"[%d] No Curl_easy associated",
                          (ulong)stream_id_00);
      }
      session_local._4_4_ = 0;
    }
    else {
      CVar4 = on_stream_frame((Curl_cfilter *)userp,data_00,frame);
      session_local._4_4_ = 0;
      if (CVar4 != CURLE_OK) {
        session_local._4_4_ = -0x386;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int on_frame_recv(nghttp2_session *session, const nghttp2_frame *frame,
                         void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf), *data_s;
  int32_t stream_id = frame->hd.stream_id;

  DEBUGASSERT(data);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  if(Curl_trc_cf_is_verbose(cf, data)) {
    char buffer[256];
    int len;
    len = fr_print(frame, buffer, sizeof(buffer)-1);
    buffer[len] = 0;
    CURL_TRC_CF(data, cf, "[%d] <- %s",frame->hd.stream_id, buffer);
  }
#endif /* !CURL_DISABLE_VERBOSE_STRINGS */

  if(!stream_id) {
    /* stream ID zero is for connection-oriented stuff */
    DEBUGASSERT(data);
    switch(frame->hd.type) {
    case NGHTTP2_SETTINGS: {
      if(!(frame->hd.flags & NGHTTP2_FLAG_ACK)) {
        uint32_t max_conn = ctx->max_concurrent_streams;
        ctx->max_concurrent_streams = nghttp2_session_get_remote_settings(
            session, NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
        ctx->enable_push = nghttp2_session_get_remote_settings(
            session, NGHTTP2_SETTINGS_ENABLE_PUSH) != 0;
        CURL_TRC_CF(data, cf, "[0] MAX_CONCURRENT_STREAMS: %d",
                    ctx->max_concurrent_streams);
        CURL_TRC_CF(data, cf, "[0] ENABLE_PUSH: %s",
                    ctx->enable_push ? "TRUE" : "false");
        if(data && max_conn != ctx->max_concurrent_streams) {
          /* only signal change if the value actually changed */
          CURL_TRC_CF(data, cf, "[0] notify MAX_CONCURRENT_STREAMS: %u",
                      ctx->max_concurrent_streams);
          Curl_multi_connchanged(data->multi);
        }
        /* Since the initial stream window is 64K, a request might be on HOLD,
         * due to exhaustion. The (initial) SETTINGS may announce a much larger
         * window and *assume* that we treat this like a WINDOW_UPDATE. Some
         * servers send an explicit WINDOW_UPDATE, but not all seem to do that.
         * To be safe, we UNHOLD a stream in order not to stall. */
        if(CURL_WANT_SEND(data)) {
          struct stream_ctx *stream = H2_STREAM_CTX(data);
          if(stream)
            drain_stream(cf, data, stream);
        }
      }
      break;
    }
    case NGHTTP2_GOAWAY:
      ctx->goaway = TRUE;
      ctx->goaway_error = frame->goaway.error_code;
      ctx->last_stream_id = frame->goaway.last_stream_id;
      if(data) {
        infof(data, "received GOAWAY, error=%d, last_stream=%u",
                    ctx->goaway_error, ctx->last_stream_id);
        Curl_multi_connchanged(data->multi);
      }
      break;
    default:
      break;
    }
    return 0;
  }

  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s) {
    CURL_TRC_CF(data, cf, "[%d] No Curl_easy associated", stream_id);
    return 0;
  }

  return on_stream_frame(cf, data_s, frame)? NGHTTP2_ERR_CALLBACK_FAILURE : 0;
}